

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O2

bool __thiscall
miniply::PLYReader::ascii_value(PLYReader *this,PLYPropertyType propType,uint8_t *value)

{
  bool bVar1;
  int *value_00;
  int tmpInt;
  int local_1c;
  
  local_1c = 0;
  if (propType < Int) {
    value_00 = &local_1c;
  }
  else {
    value_00 = (int *)value;
    if (1 < propType - Int) {
      if (propType == Float) {
        bVar1 = float_literal(this,(float *)value);
        this->m_valid = bVar1;
        if (!bVar1) {
          return false;
        }
        advance(this);
        return true;
      }
      bVar1 = double_literal(this,(double *)value);
      goto LAB_001054c0;
    }
  }
  bVar1 = int_literal(this,value_00);
LAB_001054c0:
  this->m_valid = bVar1;
  if (bVar1 == false) {
    return false;
  }
  advance(this);
  switch(propType) {
  case Char:
  case UChar:
    *value = (uint8_t)local_1c;
    return true;
  case Short:
  case UShort:
    *(undefined2 *)value = (undefined2)local_1c;
    return true;
  default:
    return true;
  }
}

Assistant:

bool PLYReader::ascii_value(PLYPropertyType propType, uint8_t value[8])
  {
    int tmpInt = 0;

    switch (propType) {
    case PLYPropertyType::Char:
    case PLYPropertyType::UChar:
    case PLYPropertyType::Short:
    case PLYPropertyType::UShort:
      m_valid = int_literal(&tmpInt);
      break;
    case PLYPropertyType::Int:
    case PLYPropertyType::UInt:
      m_valid = int_literal(reinterpret_cast<int*>(value));
      break;
    case PLYPropertyType::Float:
      m_valid = float_literal(reinterpret_cast<float*>(value));
      break;
    case PLYPropertyType::Double:
    default:
      m_valid = double_literal(reinterpret_cast<double*>(value));
      break;
    }

    if (!m_valid) {
      return false;
    }
    advance();

    switch (propType) {
    case PLYPropertyType::Char:
      reinterpret_cast<int8_t*>(value)[0] = static_cast<int8_t>(tmpInt);
      break;
    case PLYPropertyType::UChar:
      value[0] = static_cast<uint8_t>(tmpInt);
      break;
    case PLYPropertyType::Short:
      reinterpret_cast<int16_t*>(value)[0] = static_cast<int16_t>(tmpInt);
      break;
    case PLYPropertyType::UShort:
      reinterpret_cast<uint16_t*>(value)[0] = static_cast<uint16_t>(tmpInt);
      break;
    default:
      break;
    }
    return true;
  }